

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O0

JavascriptString *
Js::WebAssemblyModule::GetExternalKindString(ScriptContext *scriptContext,ExternalKinds kind)

{
  code *pcVar1;
  bool bVar2;
  JavascriptLibrary *pJVar3;
  undefined4 *puVar4;
  ExternalKinds kind_local;
  ScriptContext *scriptContext_local;
  
  switch(kind) {
  case Function:
    pJVar3 = ScriptContext::GetLibrary(scriptContext);
    scriptContext_local =
         (ScriptContext *)
         JavascriptLibrary::CreateStringFromCppLiteral<9ul>(pJVar3,(char16 (*) [9])0x18b99d4);
    break;
  case Table:
    pJVar3 = ScriptContext::GetLibrary(scriptContext);
    scriptContext_local =
         (ScriptContext *)
         JavascriptLibrary::CreateStringFromCppLiteral<6ul>(pJVar3,(char16 (*) [6])0x1777318);
    break;
  case Memory:
    pJVar3 = ScriptContext::GetLibrary(scriptContext);
    scriptContext_local =
         (ScriptContext *)
         JavascriptLibrary::CreateStringFromCppLiteral<7ul>(pJVar3,(char16 (*) [7])0x198e100);
    break;
  case Global:
    pJVar3 = ScriptContext::GetLibrary(scriptContext);
    scriptContext_local =
         (ScriptContext *)
         JavascriptLibrary::CreateStringFromCppLiteral<7ul>(pJVar3,(char16 (*) [7])0x19a0fea);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x3b8,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    scriptContext_local = (ScriptContext *)0x0;
  }
  return (JavascriptString *)scriptContext_local;
}

Assistant:

JavascriptString *
WebAssemblyModule::GetExternalKindString(ScriptContext * scriptContext, Wasm::ExternalKinds kind)
{
    switch (kind)
    {
    case Wasm::ExternalKinds::Function:
        return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("function"));
    case Wasm::ExternalKinds::Table:
        return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("table"));
    case Wasm::ExternalKinds::Memory:
        return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("memory"));
    case Wasm::ExternalKinds::Global:
        return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("global"));
    default:
        Assume(UNREACHED);
    }
    return nullptr;
}